

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

hittable_list * simple_light(void)

{
  vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_> *this;
  hittable_list *in_RDI;
  int local_c0 [2];
  shared_ptr<lambertian> local_b8;
  shared_ptr<diffuse_light> difflight;
  undefined1 local_91;
  vec3 local_90;
  shared_ptr<noise_texture> pertext;
  int local_68 [2];
  value_type local_60;
  value_type local_50;
  value_type local_40;
  value_type local_30;
  
  (in_RDI->super_hittable)._vptr_hittable = (_func_int **)&PTR_hit_0012e0b8;
  this = &in_RDI->objects;
  (in_RDI->objects).
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->objects).
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->objects).
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90.e[0] = (double)CONCAT44(local_90.e[0]._4_4_,4);
  pertext.super___shared_ptr<noise_texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<noise_texture,std::allocator<noise_texture>,int>
            (&pertext.super___shared_ptr<noise_texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (noise_texture **)&pertext,(allocator<noise_texture> *)&difflight,(int *)&local_90);
  local_90.e[0] = 0.0;
  local_90.e[1] = -1000.0;
  local_90.e[2] = 0.0;
  local_c0[1] = 1000;
  local_b8.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<lambertian,std::allocator<lambertian>,std::shared_ptr<noise_texture>&>
            (&local_b8.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (lambertian **)&local_b8,(allocator<lambertian> *)local_c0,&pertext);
  difflight.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<sphere,std::allocator<sphere>,vec3,int,std::shared_ptr<lambertian>>
            (&difflight.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (sphere **)&difflight,(allocator<sphere> *)local_c0,&local_90,local_c0 + 1,&local_b8);
  local_30.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       difflight.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_30.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       difflight.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  difflight.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  difflight.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (this,&local_30);
  if (local_30.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (difflight.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (difflight.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_b8.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  local_90.e[0] = 0.0;
  local_90.e[1] = 2.0;
  local_90.e[2] = 0.0;
  local_c0[1] = 2;
  local_b8.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<lambertian,std::allocator<lambertian>,std::shared_ptr<noise_texture>&>
            (&local_b8.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (lambertian **)&local_b8,(allocator<lambertian> *)local_c0,&pertext);
  difflight.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<sphere,std::allocator<sphere>,vec3,int,std::shared_ptr<lambertian>>
            (&difflight.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (sphere **)&difflight,(allocator<sphere> *)local_c0,&local_90,local_c0 + 1,&local_b8);
  local_40.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       difflight.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_40.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       difflight.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  difflight.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  difflight.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (this,&local_40);
  if (local_40.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (difflight.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (difflight.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_b8.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  local_90.e[0] = 0.0;
  local_90.e[1] = (double)operator_new(0x30);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90.e[1])->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90.e[1])->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90.e[1])->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_0012e630;
  local_90.e[0] = (double)((long)local_90.e[1] + 0x10);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_90.e[1] + 0x10))->_M_use_count = 0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_90.e[1] + 0x10))->_M_weak_count =
       0x40100000;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_90.e[1] + 0x20))->
  _vptr__Sp_counted_base = (_func_int **)0x4010000000000000;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_90.e[1] + 0x20))->_M_use_count = 0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_90.e[1] + 0x20))->_M_weak_count =
       0x40100000;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_90.e[1] + 0x10))->
  _vptr__Sp_counted_base = (_func_int **)&PTR_value_0012e680;
  difflight.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<diffuse_light,std::allocator<diffuse_light>,std::shared_ptr<constant_texture>>
            (&difflight.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (diffuse_light **)&difflight,(allocator<diffuse_light> *)&local_b8,
             (shared_ptr<constant_texture> *)&local_90);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90.e[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90.e[1]);
  }
  local_90.e[0] = 0.0;
  local_90.e[1] = 7.0;
  local_90.e[2] = 0.0;
  local_c0[1] = 2;
  local_b8.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<sphere,std::allocator<sphere>,vec3,int,std::shared_ptr<diffuse_light>&>
            (&local_b8.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (sphere **)&local_b8,(allocator<sphere> *)local_c0,&local_90,local_c0 + 1,&difflight);
  local_50.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_b8.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_50.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_b8.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_b8.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_b8.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (this,&local_50);
  if (local_50.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_b8.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  local_b8.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(local_b8.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_,3);
  local_c0[1] = 5;
  local_c0[0] = 1;
  local_68[1] = 3;
  local_68[0] = -2;
  local_90.e[0] = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<xy_rect,std::allocator<xy_rect>,int,int,int,int,int,std::shared_ptr<diffuse_light>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_90.e + 1),(xy_rect **)&local_90,
             (allocator<xy_rect> *)&local_91,(int *)&local_b8,local_c0 + 1,local_c0,local_68 + 1,
             local_68,&difflight);
  local_60.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_90.e[0];
  local_60.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90.e[1];
  local_90.e[0] = 0.0;
  local_90.e[1] = 0.0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (this,&local_60);
  if (local_60.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90.e[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90.e[1]);
  }
  if (difflight.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (difflight.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (pertext.super___shared_ptr<noise_texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (pertext.super___shared_ptr<noise_texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return in_RDI;
}

Assistant:

hittable_list simple_light() {
    hittable_list objects;

    auto pertext = make_shared<noise_texture>(4);
    objects.add(make_shared<sphere>(vec3(0,-1000, 0), 1000, make_shared<lambertian>(pertext)));
    objects.add(make_shared<sphere>(vec3(0,2,0), 2, make_shared<lambertian>(pertext)));

    auto difflight = make_shared<diffuse_light>(make_shared<constant_texture>(vec3(4,4,4)));
    objects.add(make_shared<sphere>(vec3(0,7,0), 2, difflight));
    objects.add(make_shared<xy_rect>(3, 5, 1, 3, -2, difflight));

    return objects;
}